

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O2

optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>
* __thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>
::
Simplex_coboundary_enumerator_<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Tag_dense>
::next_raw(optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>
           *__return_storage_ptr__,
          Simplex_coboundary_enumerator_<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Tag_dense>
          *this,bool all_cofacets)

{
  long *plVar1;
  simplex_t *psVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int *piVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>
  *__return_storage_ptr___00;
  ulong uVar10;
  int iVar11;
  undefined1 i [16];
  simplex_t sVar12;
  bool bVar13;
  char cVar14;
  undefined4 in_EAX;
  simplex_t *psVar15;
  simplex_t *psVar16;
  logic_error *this_00;
  int *piVar17;
  entry_t *peVar18;
  long in_RCX;
  int extraout_EDX;
  ulong extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 unaff_RBX;
  uint uVar19;
  ulong uVar20;
  float fVar21;
  float fVar22;
  
  bVar13 = has_next(this,all_cofacets);
  if (bVar13) {
    uVar19 = this->j;
    cVar14 = this->k;
    while( true ) {
      psVar15 = Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::operator()
                          ((simplex_t *)this->simplex_encoding,
                           (Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_> *)
                           (ulong)uVar19,(int)cVar14,(dimension_t)in_RCX);
      uVar6 = *(ulong *)((long)&this->idx_below + 8);
      uVar20 = (ulong)(*(simplex_t **)&this->idx_below < psVar15);
      uVar10 = uVar6 - extraout_RDX;
      in_RCX = uVar10 - uVar20;
      if (uVar6 < extraout_RDX || uVar10 < uVar20) break;
      psVar16 = Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::operator()
                          ((simplex_t *)this->simplex_encoding,
                           (Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_> *)
                           (ulong)(uint)this->j,(int)this->k,(dimension_t)in_RCX);
      psVar15 = *(simplex_t **)&this->idx_below;
      *(long *)&this->idx_below = (long)this->idx_below - (long)psVar16;
      plVar1 = (long *)((long)&this->idx_below + 8);
      *plVar1 = (*plVar1 - extraout_RDX_00) - (ulong)(psVar15 < psVar16);
      psVar15 = Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::operator()
                          ((simplex_t *)this->simplex_encoding,
                           (Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_> *)
                           (ulong)(uint)this->j,(int)(char)(this->k + '\x01'),(dimension_t)in_RCX);
      psVar2 = &this->idx_above;
      sVar12 = *psVar2;
      *(long *)psVar2 = (long)*psVar2 + (long)psVar15;
      plVar1 = (long *)((long)&this->idx_above + 8);
      *plVar1 = *plVar1 + extraout_RDX_01 + (ulong)CARRY8((ulong)sVar12,(ulong)psVar15);
      uVar19 = this->j - 1;
      this->j = uVar19;
      cVar3 = this->k;
      cVar14 = cVar3 + -1;
      this->k = cVar14;
      if (cVar3 == '\0') {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this_00,"");
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    }
    piVar7 = (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    iVar4 = this->j;
    fVar22 = (this->simplex).
             super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::entry_with_coeff_t>
             .first;
    for (piVar17 = (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start; piVar17 != piVar7; piVar17 = piVar17 + 1) {
      iVar5 = *piVar17;
      fVar21 = 0.0;
      if (iVar4 != iVar5) {
        iVar11 = iVar5;
        if (iVar5 < iVar4) {
          iVar11 = iVar4;
        }
        if (iVar4 < iVar5) {
          iVar5 = iVar4;
        }
        fVar21 = (this->dist->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar11][iVar5];
      }
      if (fVar21 <= fVar22) {
        fVar21 = fVar22;
      }
      fVar22 = fVar21;
    }
    uVar6 = (ulong)this->idx_above;
    uVar8 = *(undefined8 *)((long)&this->idx_above + 8);
    uVar19 = this->j;
    this->j = uVar19 - 1;
    psVar15 = Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::operator()
                        ((simplex_t *)this->simplex_encoding,
                         (Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_> *)
                         (ulong)uVar19,(int)(char)(this->k + '\x01'),(dimension_t)piVar7);
    sVar12 = this->idx_below;
    uVar20 = uVar6 + (long)this->idx_below;
    uVar9 = *(undefined8 *)((long)&this->idx_below + 8);
    __return_storage_ptr___00 = this->parent;
    __ashlti3(0xffffffffffffffff,0xffffffffffffffff,(char)__return_storage_ptr___00->bits_for_coeff)
    ;
    i._4_4_ = fVar22;
    i._0_4_ = in_EAX;
    i._8_8_ = unaff_RBX;
    peVar18 = make_entry((entry_t *)__return_storage_ptr___00,
                         (Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>
                          *)(uVar20 + (long)psVar15),(simplex_t)i,
                         extraout_EDX +
                         (int)uVar8 + (int)uVar9 + (uint)CARRY8(uVar6,(ulong)sVar12) +
                         (uint)CARRY8(uVar20,(ulong)psVar15));
    (__return_storage_ptr__->
    super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t,_true,_true>
    )._M_payload.
    super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>
    ._M_payload._M_value.
    super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::entry_with_coeff_t>
    .first = fVar22;
    *(entry_t **)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t,_true,_true>
             )._M_payload.
             super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>
             ._M_payload + 0x10) = peVar18;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t,_true,_true>
             )._M_payload.
             super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>
             ._M_payload + 0x18) = extraout_RDX_02;
    bVar13 = true;
  }
  else {
    bVar13 = false;
  }
  (__return_storage_ptr__->
  super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t,_true,_true>
  )._M_payload.
  super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>
  ._M_engaged = bVar13;
  return __return_storage_ptr__;
}

Assistant:

std::optional<diameter_entry_t> next_raw(bool all_cofacets = true) {
      if (!has_next(all_cofacets)) return std::nullopt;
      // this requires simplex_encoding(x,0)>0
      while (simplex_encoding(j, k) <= idx_below) {
        idx_below -= simplex_encoding(j, k);
        idx_above += simplex_encoding(j, k + 1);
        --j;
        --k;
        GUDHI_assert(k != -1);
      }
      value_t cofacet_diameter = get_diameter(simplex);
      // The order of j and i matters for performance
      for (vertex_t i : vertices) cofacet_diameter = std::max(cofacet_diameter, dist(j, i));
      simplex_t cofacet_index = idx_above + simplex_encoding(j--, k + 1) + idx_below;
      coefficient_t cofacet_coefficient = parent.get_coefficient(simplex);
      if (k & 1) cofacet_coefficient = parent.modulus - cofacet_coefficient;
      return parent.make_diameter_entry(cofacet_diameter, cofacet_index, cofacet_coefficient);
    }